

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O1

void __thiscall QHybrid::ComputeQ(QHybrid *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *plVar3;
  char cVar4;
  undefined4 uVar5;
  long lVar6;
  PlanningUnitMADPDiscrete *this_00;
  JointBeliefInterface *pJVar7;
  E *this_01;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  BeliefIteratorGeneric it;
  ulong local_48;
  undefined **local_40;
  long *local_38;
  undefined1 extraout_var [56];
  
  lVar6 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
  lVar6 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6) + 0x60))
                    (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6);
  if (lVar6 == 0) {
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,"QHybrid::ComputeQ - GetPU() returns 0; no PlanningUnit available!");
  }
  else {
    lVar6 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
    this_00 = (PlanningUnitMADPDiscrete *)
              (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6) + 0x60
                          ))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6);
    pJVar7 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(this_00);
    lVar6 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
    lVar6 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6) + 0x60))
                      (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6);
    if (*(size_t *)(lVar6 + 0x18) != this->_m_horizonLastTimeSteps) {
      lVar6 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      lVar6 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6) + 0x60
                          ))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6);
      lVar6 = (**(code **)(**(long **)(lVar6 + 0x30) + 0x68))();
      if (lVar6 != 0) {
        uVar8 = 0;
        do {
          (**(code **)(*(long *)(&pJVar7->field_0x0 + *(long *)((long)*pJVar7 + -0xb8)) + 0x98))
                    (&local_40,&pJVar7->field_0x0 + *(long *)((long)*pJVar7 + -0xb8));
          local_48 = 0;
          do {
            lVar6 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
            lVar6 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6)
                                + 0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6);
            uVar5 = (**(code **)(*local_38 + 0x18))();
            uVar9 = (**(code **)(**(long **)(lVar6 + 0x330) + 0xc0))
                              (*(long **)(lVar6 + 0x330),uVar5,uVar8);
            uVar10 = (**(code **)(*local_38 + 0x10))();
            cVar4 = (**(code **)(*local_38 + 0x20))();
            auVar12._8_8_ = 0;
            auVar12._0_8_ = local_48;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = uVar10;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = uVar9;
            auVar1 = vfmadd231sd_fma(auVar12,auVar15,auVar1);
            local_48 = auVar1._0_8_;
          } while (cVar4 != '\0');
          dVar11 = ComputeRecursively(this,1,0,(Index)uVar8);
          lVar6 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
          lVar6 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6) +
                              0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6);
          plVar3 = *(long **)(lVar6 + 0x330);
          auVar14._0_8_ =
               (**(code **)(*(long *)((long)plVar3 + *(long *)(*plVar3 + -0xb0)) + 0x70))
                         ((long)plVar3 + *(long *)(*plVar3 + -0xb0));
          auVar14._8_56_ = extraout_var;
          auVar13 = auVar14._0_16_;
          local_40 = &PTR__BeliefIteratorGeneric_0059cb30;
          if (local_38 != (long *)0x0) {
            (**(code **)(*local_38 + 8))();
            auVar13._8_8_ = 0;
            auVar13._0_8_ = auVar14._0_8_;
          }
          auVar16._8_8_ = 0;
          auVar16._0_8_ = dVar11;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_48;
          auVar1 = vfmadd213sd_fma(auVar16,auVar13,auVar2);
          (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.data_[uVar8] = auVar1._0_8_;
          uVar8 = (ulong)((Index)uVar8 + 1);
          lVar6 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
          lVar6 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6) +
                              0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar6);
          uVar9 = (**(code **)(**(long **)(lVar6 + 0x30) + 0x68))();
        } while (uVar8 < uVar9);
      }
      if (pJVar7 != (JointBeliefInterface *)0x0) {
        (**(code **)((long)*pJVar7 + 8))(pJVar7);
      }
      return;
    }
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,"QHybrid::ComputeQ - last_t is true, not possible");
  }
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

void QHybrid::ComputeQ()
{
    if(GetPU() == 0)
        throw E("QHybrid::ComputeQ - GetPU() returns 0; no PlanningUnit available!");

    size_t time_step = 0;
    JointBeliefInterface* b0p = GetPU()->GetNewJointBeliefFromISD(); 
    JointBeliefInterface& b0 =  *b0p;
    
    bool last_t = false;
    if( (time_step) == (GetPU()->GetHorizon() -
                        _m_horizonLastTimeSteps))
        last_t = true;

    if(last_t)
        throw E("QHybrid::ComputeQ - last_t is true, not possible");


    size_t empty_jaohI = 0;
    for(Index newJAI=0; newJAI < GetPU()->GetNrJointActions(); newJAI++)
    {
        double Q=0.0;
        if(last_t)
        {
            if(_m_QlastTimeSteps)
                Q = _m_QlastTimeSteps->GetQ(b0,
                                            Globals::INITIAL_JAOHI,
                                            newJAI);
            else
            {
                BeliefIteratorGeneric it=b0.GetIterator();
                do
                {
                    double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), newJAI);
                    double prob_s = it.GetProbability();
                    Q += r_s_ja * prob_s;
                } while(it.Next());
                
            }
        }
        else
        {
            //calculate R(joah',newJA) - expected immediate reward for time_step
            double exp_imm_R = 0.0;
            BeliefIteratorGeneric it=b0.GetIterator();
            do
            {
                double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), newJAI);
                double prob_s = it.GetProbability();
                exp_imm_R += r_s_ja * prob_s;
            } while(it.Next());

            double exp_fut_R = ComputeRecursively( 1, Globals::INITIAL_JAOHI, newJAI);

            Q = exp_imm_R + GetPU()->GetDiscount() * exp_fut_R;
        }
        _m_QValuesFirstTimeSteps(empty_jaohI,newJAI)=Q;
    }//end for newJAI

    delete b0p;
    return;
}